

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseTrue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,LottieParserImpl>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is,LottieParserImpl *handler)

{
  Ch *pCVar1;
  Ch *pCVar2;
  
  pCVar1 = is->src_;
  pCVar2 = pCVar1 + 1;
  is->src_ = pCVar2;
  if (pCVar1[1] == 'r') {
    pCVar2 = pCVar1 + 2;
    is->src_ = pCVar2;
    if (pCVar1[2] == 'u') {
      pCVar2 = pCVar1 + 3;
      is->src_ = pCVar2;
      if (pCVar1[3] == 'e') {
        is->src_ = pCVar1 + 4;
        (handler->super_LookaheadParserHandler).st_ = kHasBool;
        (handler->super_LookaheadParserHandler).v_.data_.n = (Number)0x0;
        (handler->super_LookaheadParserHandler).v_.data_.s.str = (Ch *)0x0;
        (handler->super_LookaheadParserHandler).v_.data_.f.flags = 10;
        return;
      }
    }
  }
  pCVar1 = is->head_;
  (this->parseResult_).code_ = kParseErrorValueInvalid;
  (this->parseResult_).offset_ = (long)pCVar2 - (long)pCVar1;
  return;
}

Assistant:

Ch Take() { return *src_++; }